

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O1

void __thiscall cursespp::ListOverlay::ListOverlay(ListOverlay *this)

{
  _Rb_tree_header *p_Var1;
  shared_ptr<cursespp::Window> *this_00;
  shared_ptr<cursespp::ListOverlay::CustomListWindow> *this_01;
  element_type *peVar2;
  element_type *peVar3;
  Window *this_02;
  CustomListWindow *this_03;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  OverlayBase::OverlayBase(&this->super_OverlayBase);
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a69e0;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->super_has_slots<sigslot::multi_threaded_local>).
                      super_multi_threaded_local.m_mutex,(pthread_mutexattr_t *)0x0);
  p_Var1 = &(this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__ListOverlay_001a8d78;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&DAT_001a9000;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__ListOverlay_001a9030;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__ListOverlay_001a9058;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__ListOverlay_001a9080;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__ListOverlay_001a9128;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ListOverlay_001a9150;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ListOverlay_001a9178;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ListOverlay_001a91a8;
  (this->super_OverlayBase).super_IOverlay._vptr_IOverlay = (_func_int **)&PTR__ListOverlay_001a91d8
  ;
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__ListOverlay_001a9200;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  memset(&this->adapter,0,0xb0);
  Window::SetFrameVisible((Window *)this,true);
  local_30 = 0x1600;
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[10])(this);
  local_38 = 0x1700;
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[9])(this);
  this->autoDismiss = true;
  this->width = 0;
  this->height = 0;
  this->setWidth = 0;
  this->setWidthPercent = 0;
  this_02 = (Window *)operator_new(0x110);
  Window::Window(this_02,(IWindow *)0x0);
  this_00 = &this->scrollbar;
  std::__shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>::reset<cursespp::Window>
            (&this_00->super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>,this_02);
  peVar2 = (this_00->super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*(peVar2->super_IWindow).super_IOrderable._vptr_IOrderable[0x11])(peVar2,0);
  local_40 = 0x1700;
  (*(((this_00->super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_IWindow).super_IOrderable._vptr_IOrderable[9])();
  this_03 = (CustomListWindow *)operator_new(0x318);
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/ListOverlay.cpp:96:22)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/ListOverlay.cpp:96:22)>
             ::_M_manager;
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/ListOverlay.cpp:102:27)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/ListOverlay.cpp:102:27)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  local_78._M_unused._M_object = this;
  CustomListWindow::CustomListWindow(this_03,(Callback *)&local_78,(Callback *)&local_98);
  this_01 = &this->listWindow;
  std::__shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>::
  reset<cursespp::ListOverlay::CustomListWindow>
            (&this_01->
              super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ,this_03);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_48 = 0x1700;
  (**(code **)(*(long *)&(((this_01->
                           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x48))();
  local_50 = 0x1700;
  (**(code **)(*(long *)&(((this_01->
                           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x60))();
  peVar3 = (this_01->
           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (**(code **)(*(long *)&(peVar3->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x88))(peVar3,0);
  sigslot::signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::
  connect<cursespp::ListOverlay>
            (&(((this->listWindow).
                super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_ListWindow).EntryActivated,this,
             (offset_in_ListOverlay_to_subr)OnListEntryActivated);
  peVar3 = (this_01->
           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (**(code **)(*(long *)&(peVar3->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x100))(peVar3,0);
  local_a8 = (this->scrollbar).super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_a0 = (this->scrollbar).super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_a0->_M_use_count = local_a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_a0->_M_use_count = local_a0->_M_use_count + 1;
    }
  }
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[0x46])(this,&local_a8);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  local_b8 = (this->listWindow).
             super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_b0 = (this->listWindow).
             super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b0->_M_use_count = local_b0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_b0->_M_use_count = local_b0->_M_use_count + 1;
    }
  }
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[0x46])(this,&local_b8);
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  return;
}

Assistant:

ListOverlay::ListOverlay() {
    this->SetFrameVisible(true);
    this->SetFrameColor(Color::OverlayFrame);
    this->SetContentColor(Color::OverlayContent);

    this->autoDismiss = true;

    this->width = this->height = 0;
    this->setWidth = this->setWidthPercent = 0;

    auto decorator = [this] {
        if (this->ScrollbarVisible()) {
            Scrollbar::Draw(this->listWindow.get(), this->scrollbar.get());
        }
    };

    auto adapterChanged = [this] { this->Layout(); };

    this->scrollbar.reset(new Window());
    this->scrollbar->SetFrameVisible(false);
    this->scrollbar->SetContentColor(Color::OverlayContent);

    this->listWindow.reset(new CustomListWindow(decorator, adapterChanged));
    this->listWindow->SetContentColor(Color::OverlayContent);
    this->listWindow->SetFocusedContentColor(Color::OverlayContent);
    this->listWindow->SetFrameVisible(false);
    this->listWindow->EntryActivated.connect(this, &ListOverlay::OnListEntryActivated);

    this->listWindow->SetFocusOrder(0);
    this->AddWindow(this->scrollbar);
    this->AddWindow(this->listWindow);
}